

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

bool __thiscall Js::JavascriptSet::Has(JavascriptSet *this,Var value)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  BVSparse<Memory::Recycler> *this_01;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  undefined4 *puVar5;
  Var local_68;
  Var simpleVar;
  int32 intVal;
  Var local_50;
  Var taggedInt;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  Var value_local;
  JavascriptSet *this_local;
  
  jsReentLock._24_8_ = value;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  switch(this->kind) {
  case EmptySet:
    this_local._7_1_ = false;
    break;
  case IntSet:
    local_50 = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,true>((Var)jsReentLock._24_8_)
    ;
    if (local_50 == (Var)0x0) {
      this_local._7_1_ = false;
    }
    else {
      simpleVar._0_4_ = TaggedInt::ToInt32(local_50);
      this_01 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->
                          ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet);
      BVar2 = BVSparse<Memory::Recycler>::Test(this_01,(BVIndex)simpleVar);
      this_local._7_1_ = BVar2 != '\0';
    }
    break;
  case SimpleVarSet:
    pBVar4 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&(this->u).simpleVarSet);
    bVar3 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(pBVar4,(void **)&jsReentLock.m_savedNoJsReentrancy);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      local_68 = JavascriptConversion::TryCanonicalizeAsSimpleVar<true>((Var)jsReentLock._24_8_);
      if ((local_68 == (Var)0x0) || (local_68 == (Var)jsReentLock._24_8_)) {
        this_local._7_1_ = false;
      }
      else {
        pBVar4 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&(this->u).simpleVarSet);
        this_local._7_1_ =
             JsUtil::
             BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::ContainsKey(pBVar4,&local_68);
      }
    }
    break;
  case ComplexVarSet:
    this_02 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)&(this->u).simpleVarSet);
    this_local._7_1_ =
         JsUtil::
         BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         ::ContainsKey(this_02,(void **)&jsReentLock.m_savedNoJsReentrancy);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x252,"((0))","(0)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local._7_1_ = false;
  }
  taggedInt._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return this_local._7_1_;
}

Assistant:

bool JavascriptSet::Has(Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
        return false;

    case SetKind::IntSet:
    {
        Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, true /* allowLossyConversion */ >(value);
        if (!taggedInt)
        {
            return false;
        }
        int32 intVal = TaggedInt::ToInt32(taggedInt);
        return this->u.intSet->Test(intVal);
    }

    case SetKind::SimpleVarSet:
    {
        // First check if the value is in the set
        if (this->u.simpleVarSet->ContainsKey(value))
        {
            return true;
        }
        // If the value isn't in the set, check if the canonical value is
        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<true /* allowLossyConversion */>(value);
        // If the simple value is the same as the original value, we know it isn't in the set
        if (!simpleVar || simpleVar == value)
        {
            return false;
        }

        return this->u.simpleVarSet->ContainsKey(simpleVar);
    }

    case SetKind::ComplexVarSet:
        return this->u.complexVarSet->ContainsKey(value);

    default:
        Assume(UNREACHED);
        return false;
    }
}